

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O1

void __thiscall pg::SSPMSolver::stream_pm(SSPMSolver *this,ostream *out,int idx)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  
  lVar2 = (long)idx * (long)this->l;
  if (this->pm_d[lVar2] == -1) {
    pcVar3 = " \x1b[1;33mTop\x1b[m";
    lVar2 = 0xe;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," { ",3);
    if (0 < this->h) {
      iVar5 = 0;
      lVar4 = 0;
      do {
        if (iVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        bVar6 = true;
        if ((int)lVar4 < this->l) {
          lVar4 = (long)(int)lVar4;
          iVar1 = 0;
          do {
            if (this->pm_d[(int)lVar2 + lVar4] != iVar5) goto LAB_0016fbbf;
            iVar1 = iVar1 + 1;
            std::ostream::_M_insert<bool>(SUB81(out,0));
            lVar4 = lVar4 + 1;
          } while (lVar4 < this->l);
          iVar1 = 1;
LAB_0016fbbf:
          bVar6 = iVar1 == 0;
        }
        if (bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>(out,anon_var_dwarf_27da90,2);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->h);
    }
    pcVar3 = " }";
    lVar2 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,lVar2);
  return;
}

Assistant:

void
SSPMSolver::stream_pm(std::ostream &out, int idx)
{
    int base = idx*l;
    if (pm_d[base] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and pm_d[base+j] == i) {
                c++;
                out << pm_b[base+j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";
    }
}